

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O3

InstListIter
mocker::anon_unknown_0::genInst
          (Section *text,FuncSelectionContext *ctx,FunctionModule *func,const_iterator curBBIter,
          const_iterator bbIterEnd,InstListIter curInstIter)

{
  element_type *peVar1;
  _List_node_base *__val;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  ulong uVar2;
  key_type *pkVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  shared_ptr<mocker::nasm::Register> *args;
  const_iterator cVar8;
  OpType *args_00;
  OpType *pOVar9;
  long *plVar10;
  _List_node_base *p_Var11;
  ulong uVar12;
  element_type *peVar13;
  element_type *peVar14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  char cVar17;
  __node_base this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  key_type *__k;
  shared_ptr<mocker::ir::ArithBinaryInst> add;
  shared_ptr<mocker::ir::ArithBinaryInst> p;
  shared_ptr<mocker::ir::Reg> global;
  shared_ptr<mocker::nasm::Addr> rhs;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>_> local_58
  ;
  OpType local_44;
  __node_base local_40;
  __node_base local_38;
  
  p_Var16 = (bbIterEnd._M_node)->_M_next;
  peVar13 = (element_type *)bbIterEnd._M_node[1]._M_next;
  p_Var15 = (_List_node_base *)(func->identifier)._M_dataplus._M_p;
  iVar7 = (peVar13->super_IRInst).type;
  switch(iVar7) {
  case 1:
  case 2:
  case 0xf:
    this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return (InstListIter)p_Var16;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
    }
    goto LAB_00117c4b;
  case 3:
    this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
      }
    }
    local_d8._0_8_ =
         (peVar13->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._8_8_ =
         (peVar13->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_88,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_b8,
               (shared_ptr<mocker::nasm::Addr> *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    }
    goto LAB_00117aa2;
  default:
    if (iVar7 == 5) {
      local_b8._8_8_ = bbIterEnd._M_node[1]._M_prev;
      local_b8._0_8_ = peVar13;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
          UNLOCK();
          if (peVar13 == (element_type *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
            }
            goto LAB_00117ce9;
          }
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        }
      }
      local_d8._0_8_ = p_Var16[1]._M_next;
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var16[1]._M_prev;
      if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (*(int *)&(((string *)&(((element_type *)local_d8._0_8_)->super_IRInst).type)->
                     _M_dataplus)._M_p == 5) {
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_00117c76;
        }
LAB_00117b27:
        local_d8._0_8_ = (element_type *)0x0;
        local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00117b2f:
        genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_b8);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
        }
        if (*(int *)&(((string *)&(((element_type *)local_d8._0_8_)->super_IRInst).type)->
                     _M_dataplus)._M_p != 5) goto LAB_00117b27;
        local_d8._8_8_ = p_Var18;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          UNLOCK();
          if ((element_type *)local_d8._0_8_ != (element_type *)0x0) goto LAB_00117c76;
          goto LAB_00117b2f;
        }
        p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
LAB_00117c76:
        bVar6 = tryCombineMemInst(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_b8,
                                  (shared_ptr<mocker::ir::ArithBinaryInst> *)local_d8,
                                  (shared_ptr<mocker::ir::IRInst> *)(p_Var16->_M_next + 1));
        if (bVar6) {
          p_Var16 = p_Var16->_M_next->_M_next;
        }
        else {
          genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_b8);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      this._M_nxt = (_Hash_node_base *)local_b8._8_8_;
      if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        this._M_nxt = (_Hash_node_base *)local_b8._8_8_;
      }
    }
    else {
LAB_00117ce9:
      peVar13 = (element_type *)bbIterEnd._M_node[1]._M_next;
      iVar7 = (peVar13->super_IRInst).type;
      if (iVar7 == 0xd) {
        this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
          }
        }
        if ((peVar13->super_Definition).dest.
            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
          args = nasm::rax();
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                    (text,args,(shared_ptr<mocker::nasm::Addr> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
        }
        pkVar3 = DAT_001ed2e8;
        if ((anonymous_namespace)::CalleeSave != DAT_001ed2e8) {
          __k = (anonymous_namespace)::CalleeSave;
          do {
            cVar8 = std::
                    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(ctx->pRegAddr)._M_h,__k);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>const&>
                      (text,__k,(shared_ptr<mocker::nasm::Register> *)
                                ((long)cVar8.
                                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                                       ._M_cur + 0x18));
            __k = __k + 1;
          } while (__k != pkVar3);
        }
        nasm::Section::emplaceInst<mocker::nasm::Leave>(text);
        nasm::Section::emplaceInst<mocker::nasm::Ret>(text);
      }
      else if (iVar7 == 0xb) {
        local_78._24_8_ = bbIterEnd._M_node[1]._M_prev;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_)->_M_use_count + 1
            ;
          }
        }
        if (p_Var15 == curBBIter._M_node) {
          p_Var15 = (_List_node_base *)0xffffffffffffffff;
        }
        else {
          p_Var15 = p_Var15[1]._M_next;
        }
        local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
        local_b8._0_8_ = (element_type *)local_a8;
        FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_88,(string *)ctx);
        if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                  (text,(shared_ptr<mocker::nasm::Register> *)local_88,
                   (shared_ptr<mocker::nasm::Addr> *)local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        local_b8._8_8_ = operator_new(0x20);
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_weak_count = 1;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
        local_b8._0_8_ = local_b8._8_8_ + 0x10;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->
        _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e90c0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_use_count = 0;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_weak_count = 0
        ;
        nasm::Section::
        emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                  (text,(shared_ptr<mocker::nasm::Register> *)local_88,
                   (shared_ptr<mocker::nasm::NumericConstant> *)local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        p_Var11 = *(_List_node_base **)(*(long *)&peVar13->op + 8);
        if (p_Var11 == p_Var15) {
          local_58._M_array = (iterator)((ulong)local_58._M_array._4_4_ << 0x20);
          p_Var18 = (peVar13->lhs).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          uVar2._0_4_ = p_Var18->_M_use_count;
          uVar2._4_4_ = p_Var18->_M_weak_count;
          cVar17 = '\x01';
          if (9 < uVar2) {
            uVar12 = uVar2;
            cVar5 = '\x04';
            do {
              cVar17 = cVar5;
              if (uVar12 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_001185e7;
              }
              if (uVar12 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_001185e7;
              }
              if (uVar12 < 10000) goto LAB_001185e7;
              bVar6 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              cVar5 = cVar17 + '\x04';
            } while (bVar6);
            cVar17 = cVar17 + '\x01';
          }
LAB_001185e7:
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_d8._0_8_,local_d8._8_4_,uVar2);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
          peVar13 = (element_type *)(plVar10 + 2);
          if ((element_type *)*plVar10 == peVar13) {
            local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
            local_a8._8_8_ = plVar10[3];
            local_b8._0_8_ = (element_type *)local_a8;
          }
          else {
            local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
            local_b8._0_8_ = (element_type *)*plVar10;
          }
          local_b8._8_8_ = plVar10[1];
          *plVar10 = (long)peVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_78._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),(Label **)local_78
                     ,(allocator<mocker::nasm::Label> *)&local_44,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          nasm::Section::
          emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                    (text,(OpType *)&local_58,(shared_ptr<mocker::nasm::Label> *)local_78);
LAB_00118a59:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          }
          if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_d8._16_8_ + 1));
          }
        }
        else {
          __val = *(_List_node_base **)
                   &((peVar13->lhs).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count;
          if (__val == p_Var15) {
            local_58._M_array = (iterator)CONCAT44(local_58._M_array._4_4_,1);
            cVar17 = '\x01';
            if ((_List_node_base *)0x9 < p_Var11) {
              p_Var15 = p_Var11;
              cVar5 = '\x04';
              do {
                cVar17 = cVar5;
                if (p_Var15 < (_List_node_base *)0x64) {
                  cVar17 = cVar17 + -2;
                  goto LAB_001189a0;
                }
                if (p_Var15 < (_List_node_base *)0x3e8) {
                  cVar17 = cVar17 + -1;
                  goto LAB_001189a0;
                }
                if (p_Var15 < (_List_node_base *)0x2710) goto LAB_001189a0;
                bVar6 = (_List_node_base *)0x1869f < p_Var15;
                p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
                cVar5 = cVar17 + '\x04';
              } while (bVar6);
              cVar17 = cVar17 + '\x01';
            }
LAB_001189a0:
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_d8._0_8_,local_d8._8_4_,(unsigned_long)p_Var11);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
            peVar13 = (element_type *)(plVar10 + 2);
            if ((element_type *)*plVar10 == peVar13) {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_a8._8_8_ = plVar10[3];
              local_b8._0_8_ = (element_type *)local_a8;
            }
            else {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_b8._0_8_ = (element_type *)*plVar10;
            }
            local_b8._8_8_ = plVar10[1];
            *plVar10 = (long)peVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            local_78._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),
                       (Label **)local_78,(allocator<mocker::nasm::Label> *)&local_44,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
            nasm::Section::
            emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                      (text,(OpType *)&local_58,(shared_ptr<mocker::nasm::Label> *)local_78);
            goto LAB_00118a59;
          }
          local_58._M_array = (iterator)((ulong)local_58._M_array._4_4_ << 0x20);
          cVar17 = '\x01';
          if ((_List_node_base *)0x9 < __val) {
            p_Var15 = __val;
            cVar5 = '\x04';
            do {
              cVar17 = cVar5;
              if (p_Var15 < (_List_node_base *)0x64) {
                cVar17 = cVar17 + -2;
                goto LAB_00118ab7;
              }
              if (p_Var15 < (_List_node_base *)0x3e8) {
                cVar17 = cVar17 + -1;
                goto LAB_00118ab7;
              }
              if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00118ab7;
              bVar6 = (_List_node_base *)0x1869f < p_Var15;
              p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
              cVar5 = cVar17 + '\x04';
            } while (bVar6);
            cVar17 = cVar17 + '\x01';
          }
LAB_00118ab7:
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_d8._0_8_,local_d8._8_4_,(unsigned_long)__val);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
          peVar14 = (element_type *)(plVar10 + 2);
          if ((element_type *)*plVar10 == peVar14) {
            local_a8._0_8_ = (peVar14->super_IRInst)._vptr_IRInst;
            local_a8._8_8_ = plVar10[3];
            local_b8._0_8_ = (element_type *)local_a8;
          }
          else {
            local_a8._0_8_ = (peVar14->super_IRInst)._vptr_IRInst;
            local_b8._0_8_ = (element_type *)*plVar10;
          }
          peVar1 = (element_type *)(local_d8 + 0x10);
          local_b8._8_8_ = plVar10[1];
          *plVar10 = (long)peVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_78._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),(Label **)local_78
                     ,(allocator<mocker::nasm::Label> *)&local_44,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          nasm::Section::
          emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                    (text,(OpType *)&local_58,(shared_ptr<mocker::nasm::Label> *)local_78);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          }
          if ((element_type *)local_d8._0_8_ != peVar1) {
            operator_delete((void *)local_d8._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_d8._16_8_ + 1));
          }
          uVar2 = *(ulong *)(*(long *)&peVar13->op + 8);
          cVar17 = '\x01';
          if (9 < uVar2) {
            uVar12 = uVar2;
            cVar5 = '\x04';
            do {
              cVar17 = cVar5;
              if (uVar12 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_00118e4f;
              }
              if (uVar12 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_00118e4f;
              }
              if (uVar12 < 10000) goto LAB_00118e4f;
              bVar6 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              cVar5 = cVar17 + '\x04';
            } while (bVar6);
            cVar17 = cVar17 + '\x01';
          }
LAB_00118e4f:
          local_d8._0_8_ = peVar1;
          std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_d8._0_8_,local_d8._8_4_,uVar2);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
          peVar13 = (element_type *)(plVar10 + 2);
          if ((element_type *)*plVar10 == peVar13) {
            local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
            local_a8._8_8_ = plVar10[3];
            local_b8._0_8_ = (element_type *)local_a8;
          }
          else {
            local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
            local_b8._0_8_ = (element_type *)*plVar10;
          }
          local_b8._8_8_ = plVar10[1];
          *plVar10 = (long)peVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_78._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8),(Label **)local_78
                     ,(allocator<mocker::nasm::Label> *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
                    (text,(shared_ptr<mocker::nasm::Label> *)local_78);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          }
          if ((element_type *)local_d8._0_8_ != peVar1) {
            operator_delete((void *)local_d8._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_d8._16_8_ + 1));
          }
        }
        this._M_nxt = (_Hash_node_base *)local_78._24_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          this._M_nxt = (_Hash_node_base *)local_78._24_8_;
        }
      }
      else if (iVar7 == 6) {
        local_38._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt)->_M_use_count + 1
            ;
          }
        }
        if (p_Var15 == curBBIter._M_node) {
          local_40._M_nxt = (_Hash_node_base *)0xffffffffffffffff;
        }
        else {
          local_40._M_nxt = (_Hash_node_base *)p_Var15[1]._M_next;
        }
        p_Var15 = p_Var16[1]._M_next;
        if (*(int *)&p_Var15->_M_prev == 0xb) {
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var16[1]._M_prev;
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            }
          }
          local_d8._0_8_ =
               (peVar13->super_Definition).dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_d8._8_8_ =
               (peVar13->super_Definition).dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count +
                   1;
            }
          }
          ir::dycLocalReg((ir *)local_88,(shared_ptr<mocker::ir::Addr> *)&p_Var15[1]._M_prev);
          if (((((element_type *)local_88._0_8_ == (element_type *)0x0) ||
               (__n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x10))->
                      _vptr__Sp_counted_base,
               __n != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((Definition *)(local_d8._0_8_ + 0x10))->_vptr_Definition)) ||
              ((__n != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
               (iVar7 = bcmp((_List_node_base *)(((string *)(local_88._0_8_ + 8))->_M_dataplus)._M_p
                             ,(_List_node_base *)
                              (((string *)&((IRInst *)local_d8._0_8_)->type)->_M_dataplus)._M_p,
                             (size_t)__n), iVar7 != 0)))) ||
             (((p_Var15[2]._M_prev)->_M_prev != (_List_node_base *)local_40._M_nxt &&
              ((p_Var15[3]._M_prev)->_M_prev != (_List_node_base *)local_40._M_nxt)))) {
            local_78._24_8_ = (ulong)(uint)local_78._28_4_ << 0x20;
          }
          else {
            DefUseChain::getUses
                      ((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                        *)local_b8,&ctx->defUse,(shared_ptr<mocker::ir::Reg> *)local_d8);
            local_78._24_4_ =
                 (int)CONCAT71((int7)((long)(local_b8._8_8_ - local_b8._0_8_) >> 0xb),
                               (ulong)(((long)(local_b8._8_8_ - local_b8._0_8_) >> 3) *
                                      -0x5555555555555555) < 2);
            std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::
            ~vector((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_> *)
                    local_b8);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          }
        }
        else {
          local_78._24_8_ = local_78._24_8_ & 0xffffffff00000000;
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_88,(shared_ptr<mocker::ir::Addr> *)ctx);
        nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)local_b8,(shared_ptr<mocker::nasm::Addr> *)local_88);
        uVar4 = local_b8._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        if ((element_type *)uVar4 == (element_type *)0x0) {
          local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
          local_b8._0_8_ = (element_type *)local_a8;
          FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_d8,(string *)ctx);
          uVar4 = local_88._8_8_;
          local_88._8_8_ = local_d8._8_8_;
          local_88._0_8_ = local_d8._0_8_;
          local_d8._0_8_ = (element_type *)0x0;
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          }
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                    (text,(shared_ptr<mocker::nasm::Addr> *)local_88,
                     (shared_ptr<mocker::nasm::Addr> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_78,(shared_ptr<mocker::ir::Addr> *)ctx);
        nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)local_b8,(shared_ptr<mocker::nasm::Addr> *)local_78);
        if ((element_type *)local_b8._0_8_ != (element_type *)0x0) {
          __assert_fail("!nasm::dyc<nasm::LabelAddr>(rhs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                        ,0xde,
                        "bool mocker::(anonymous namespace)::genRelation(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::RelationInst> &, const std::shared_ptr<ir::IRInst> &, std::size_t)"
                       );
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        }
        nasm::Section::
        emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(shared_ptr<mocker::nasm::Addr> *)local_88,
                   (shared_ptr<mocker::nasm::Addr> *)local_78);
        if (local_78[0x18] == '\0') {
          local_58._M_array =
               (iterator)
               (peVar13->super_Definition).dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_58._M_len =
               (size_type)
               (peVar13->super_Definition).dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len)->_M_use_count +
                   1;
            }
          }
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                    ((nasm *)local_d8,(shared_ptr<mocker::nasm::Addr> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len);
          }
          local_b8._8_8_ = operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
          local_b8._0_8_ = local_b8._8_8_ + 0x10;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e90c0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_use_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_weak_count =
               0;
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                    (text,(shared_ptr<mocker::nasm::Register> *)local_d8,
                     (shared_ptr<mocker::nasm::NumericConstant> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::mp == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::mp), iVar7 != 0)) {
            local_b8._0_8_ = (element_type *)0x0;
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
            local_a8._0_8_ = (_List_node_base *)0x200000002;
            local_a8._8_8_ = 0x300000004;
            local_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000003;
            local_a8._24_8_ = (element_type *)0x500000005;
            local_58._M_len = 6;
            local_58._M_array = (iterator)local_b8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::mp,&local_58);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::mp,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::mp);
          }
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)local_b8,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          local_b8._8_8_ = operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9070;
          local_b8._0_8_ = local_b8._8_8_ + 0x10;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e90c0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_use_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._8_8_ + 0x10))->_M_weak_count =
               0;
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                    (text,&nasm::rax::res,(shared_ptr<mocker::nasm::NumericConstant> *)local_b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
          local_b8._0_4_ = peVar13->op;
          args_00 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::at
                              ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>
                                *)(anonymous_namespace)::
                                  genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                  ::mp,(OpType *)local_b8);
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)&local_58,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType_const&,std::shared_ptr<mocker::nasm::Register>const&>
                    (text,args_00,&nasm::rax::res);
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)local_b8,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                    (text,(shared_ptr<mocker::nasm::Register> *)local_d8,&nasm::rax::res);
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
        }
        else {
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::Jump2ThenMap == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::Jump2ThenMap), iVar7 != 0)) {
            local_b8._0_8_ = (element_type *)0x0;
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
            local_a8._0_8_ = (_List_node_base *)0x200000002;
            local_a8._8_8_ = 0x300000004;
            local_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000003;
            local_a8._24_8_ = (element_type *)0x500000005;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
            local_d8._0_8_ = (element_type *)local_b8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::Jump2ThenMap,
                       (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                        *)local_d8);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::Jump2ThenMap,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::Jump2ThenMap);
          }
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::Jump2ElseMap == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::Jump2ElseMap), iVar7 != 0)) {
            local_b8._0_8_ = (element_type *)0x100000000;
            local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            local_a8._0_8_ = (_List_node_base *)0x500000002;
            local_a8._8_8_ = 0x400000004;
            local_a8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x300000003;
            local_a8._24_8_ = (element_type *)0x200000005;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
            local_d8._0_8_ = (element_type *)local_b8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::Jump2ElseMap,
                       (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                        *)local_d8);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::Jump2ElseMap,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::Jump2ElseMap);
          }
          p_Var15 = p_Var16[1]._M_next;
          if (*(int *)&p_Var15->_M_prev == 0xb) {
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var16[1]._M_prev;
            if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            }
          }
          else {
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var15 = (_List_node_base *)0x0;
          }
          if ((p_Var15[2]._M_prev)->_M_prev == (_List_node_base *)local_40._M_nxt) {
            local_44 = peVar13->op;
            pOVar9 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::at
                               ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                                 *)(anonymous_namespace)::
                                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                   ::Jump2ElseMap,&local_44);
            p_Var15 = (p_Var15[3]._M_prev)->_M_prev;
            cVar17 = '\x01';
            if ((_List_node_base *)0x9 < p_Var15) {
              p_Var11 = p_Var15;
              cVar5 = '\x04';
              do {
                cVar17 = cVar5;
                if (p_Var11 < (_List_node_base *)0x64) {
                  cVar17 = cVar17 + -2;
                  goto LAB_00118c2a;
                }
                if (p_Var11 < (_List_node_base *)0x3e8) {
                  cVar17 = cVar17 + -1;
                  goto LAB_00118c2a;
                }
                if (p_Var11 < (_List_node_base *)0x2710) goto LAB_00118c2a;
                bVar6 = (_List_node_base *)0x1869f < p_Var11;
                p_Var11 = (_List_node_base *)((ulong)p_Var11 / 10000);
                cVar5 = cVar17 + '\x04';
              } while (bVar6);
              cVar17 = cVar17 + '\x01';
            }
LAB_00118c2a:
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_d8._0_8_,local_d8._8_4_,(unsigned_long)p_Var15);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
            local_b8._0_8_ = local_a8;
            peVar13 = (element_type *)(plVar10 + 2);
            if ((element_type *)*plVar10 == peVar13) {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_a8._8_8_ = plVar10[3];
            }
            else {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_b8._0_8_ = (element_type *)*plVar10;
            }
            local_b8._8_8_ = plVar10[1];
            *plVar10 = (long)peVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            local_58._M_array = (iterator)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_len,
                       (Label **)&local_58,(allocator<mocker::nasm::Label> *)(local_78 + 0x17),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
            nasm::Section::
            emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                      (text,pOVar9,(shared_ptr<mocker::nasm::Label> *)&local_58);
          }
          else {
            local_44 = peVar13->op;
            pOVar9 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::at
                               ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                                 *)(anonymous_namespace)::
                                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                   ::Jump2ThenMap,&local_44);
            p_Var15 = (p_Var15[2]._M_prev)->_M_prev;
            cVar17 = '\x01';
            if ((_List_node_base *)0x9 < p_Var15) {
              p_Var11 = p_Var15;
              cVar5 = '\x04';
              do {
                cVar17 = cVar5;
                if (p_Var11 < (_List_node_base *)0x64) {
                  cVar17 = cVar17 + -2;
                  goto LAB_00118cf9;
                }
                if (p_Var11 < (_List_node_base *)0x3e8) {
                  cVar17 = cVar17 + -1;
                  goto LAB_00118cf9;
                }
                if (p_Var11 < (_List_node_base *)0x2710) goto LAB_00118cf9;
                bVar6 = (_List_node_base *)0x1869f < p_Var11;
                p_Var11 = (_List_node_base *)((ulong)p_Var11 / 10000);
                cVar5 = cVar17 + '\x04';
              } while (bVar6);
              cVar17 = cVar17 + '\x01';
            }
LAB_00118cf9:
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_d8._0_8_,local_d8._8_4_,(unsigned_long)p_Var15);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
            local_b8._0_8_ = local_a8;
            peVar13 = (element_type *)(plVar10 + 2);
            if ((element_type *)*plVar10 == peVar13) {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_a8._8_8_ = plVar10[3];
            }
            else {
              local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
              local_b8._0_8_ = (element_type *)*plVar10;
            }
            local_b8._8_8_ = plVar10[1];
            *plVar10 = (long)peVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            local_58._M_array = (iterator)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_len,
                       (Label **)&local_58,(allocator<mocker::nasm::Label> *)(local_78 + 0x17),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
            nasm::Section::
            emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                      (text,pOVar9,(shared_ptr<mocker::nasm::Label> *)&local_58);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_len);
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          }
          if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_d8._16_8_ + 1));
          }
        }
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        this._M_nxt = local_38._M_nxt;
        if (local_78[0x18] != '\0') {
          p_Var16 = p_Var16->_M_next;
        }
      }
      else {
        if (iVar7 != 0xe) {
LAB_001187e6:
          p_Var15 = bbIterEnd._M_node[1]._M_next;
          if (*(int *)&p_Var15->_M_prev == 4) {
            this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1
                ;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1
                ;
              }
            }
            local_88._0_8_ = p_Var15[1]._M_prev;
            local_88._8_8_ = p_Var15[2]._M_next;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count
                     + 1;
              }
            }
            FuncSelectionContext::getIrAddr
                      ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
            nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                      ((nasm *)local_b8,(shared_ptr<mocker::nasm::Addr> *)local_d8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            if ((element_type *)local_b8._0_8_ == (element_type *)0x0) {
              __assert_fail("dest",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                            ,0x1df,
                            "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                           );
            }
            FuncSelectionContext::getIrAddr
                      ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                      (text,(shared_ptr<mocker::nasm::Register> *)local_b8,
                       (shared_ptr<mocker::nasm::Addr> *)local_d8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            if (*(int *)&p_Var15[2]._M_prev == 0) {
              local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
              nasm::Section::
              emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                        (text,(OpType *)local_d8,(shared_ptr<mocker::nasm::Register> *)local_b8);
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
            }
            else {
              local_d8._0_4_ = 1;
              nasm::Section::
              emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                        (text,(OpType *)local_d8,(shared_ptr<mocker::nasm::Register> *)local_b8);
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
            }
          }
          else {
            if (*(int *)&p_Var15->_M_prev != 10) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                            ,0x1e7,
                            "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                           );
            }
            this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1
                ;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1
                ;
              }
            }
            local_b8._0_8_ = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Call,std::allocator<mocker::ir::Call>,std::shared_ptr<mocker::ir::Reg>const&,char_const(&)[8],std::shared_ptr<mocker::ir::Addr>const&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                       (Call **)local_b8,(allocator<mocker::ir::Call> *)local_d8,
                       (shared_ptr<mocker::ir::Reg> *)&p_Var15[1]._M_prev,(char (*) [8])"__alloc",
                       (shared_ptr<mocker::ir::Addr> *)&p_Var15[2]._M_prev);
            genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)local_b8);
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
          }
          goto LAB_00117aa2;
        }
        local_b8._8_8_ = bbIterEnd._M_node[1]._M_prev;
        local_b8._0_8_ = peVar13;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
            UNLOCK();
            if (peVar13 == (element_type *)0x0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
              }
              goto LAB_001187e6;
            }
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
          }
        }
        genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)local_b8);
        this._M_nxt = (_Hash_node_base *)local_b8._8_8_;
      }
    }
    goto joined_r0x00118e42;
  case 7:
    this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
              ((shared_ptr<mocker::ir::Addr> *)local_d8,(Reg *)&peVar13->super_Definition);
    if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
      __assert_fail("irAddr",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                    ,0x65,
                    "void mocker::(anonymous namespace)::genStore(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Store> &)"
                   );
    }
    local_78._0_8_ = local_d8._0_8_;
    local_78._8_8_ = local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
      }
    }
    ir::dycGlobalReg((ir *)local_88,(shared_ptr<mocker::ir::Addr> *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    if ((element_type *)local_88._0_8_ == (element_type *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      FuncSelectionContext::buildMemAddr
                ((FuncSelectionContext *)local_88,(shared_ptr<mocker::ir::Reg> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                (text,(shared_ptr<mocker::nasm::MemoryAddr> *)local_88,
                 (shared_ptr<mocker::nasm::Addr> *)local_b8);
    }
    else {
      makeLabelAddr((anon_unknown_0 *)local_78,(shared_ptr<mocker::ir::Reg> *)local_88._0_8_);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                (text,(shared_ptr<mocker::nasm::LabelAddr> *)local_78,
                 (shared_ptr<mocker::nasm::Addr> *)local_b8);
LAB_00117a34:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
    }
    break;
  case 8:
    this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
      }
    }
    local_d8._0_8_ =
         (peVar13->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._8_8_ =
         (peVar13->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
              ((shared_ptr<mocker::ir::Addr> *)local_d8,(Reg *)&peVar13->op);
    if ((element_type *)local_d8._0_8_ == (element_type *)0x0) {
      __assert_fail("irAddr",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                    ,0x71,
                    "void mocker::(anonymous namespace)::genLoad(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Load> &)"
                   );
    }
    ir::dycGlobalReg((ir *)local_88,(shared_ptr<mocker::ir::Addr> *)&peVar13->op);
    if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
      makeLabelAddr((anon_unknown_0 *)local_78,(shared_ptr<mocker::ir::Reg> *)local_88._0_8_);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::LabelAddr>>
                (text,(shared_ptr<mocker::nasm::Addr> *)local_b8,
                 (shared_ptr<mocker::nasm::LabelAddr> *)local_78);
      goto LAB_00117a34;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    FuncSelectionContext::buildMemAddr
              ((FuncSelectionContext *)local_88,(shared_ptr<mocker::ir::Reg> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::MemoryAddr>>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_b8,
               (shared_ptr<mocker::nasm::MemoryAddr> *)local_88);
    break;
  case 0xc:
    this._M_nxt = (_Hash_node_base *)bbIterEnd._M_node[1]._M_prev;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt)->_M_use_count + 1;
      }
    }
    if (p_Var15 == curBBIter._M_node) {
      p_Var11 = (_List_node_base *)
                (((peVar13->super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                identifier)._M_dataplus._M_p;
    }
    else {
      p_Var11 = (_List_node_base *)
                (((peVar13->super_Definition).dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                identifier)._M_dataplus._M_p;
      if (p_Var15[1]._M_next == p_Var11) goto joined_r0x00118e42;
    }
    cVar17 = '\x01';
    if ((_List_node_base *)0x9 < p_Var11) {
      p_Var15 = p_Var11;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (p_Var15 < (_List_node_base *)0x64) {
          cVar17 = cVar17 + -2;
          goto LAB_00117b4d;
        }
        if (p_Var15 < (_List_node_base *)0x3e8) {
          cVar17 = cVar17 + -1;
          goto LAB_00117b4d;
        }
        if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00117b4d;
        bVar6 = (_List_node_base *)0x1869f < p_Var15;
        p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
        cVar5 = cVar17 + '\x04';
      } while (bVar6);
      cVar17 = cVar17 + '\x01';
    }
LAB_00117b4d:
    local_d8._0_8_ = (element_type *)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct((ulong)local_d8,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_d8._0_8_,local_d8._8_4_,(unsigned_long)p_Var11);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x1a76f2);
    peVar13 = (element_type *)(plVar10 + 2);
    if ((element_type *)*plVar10 == peVar13) {
      local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
      local_a8._8_8_ = plVar10[3];
      local_b8._0_8_ = (element_type *)local_a8;
    }
    else {
      local_a8._0_8_ = (peVar13->super_IRInst)._vptr_IRInst;
      local_b8._0_8_ = (element_type *)*plVar10;
    }
    local_b8._8_8_ = plVar10[1];
    *plVar10 = (long)peVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_88._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),(Label **)local_88,
               (allocator<mocker::nasm::Label> *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
              (text,(shared_ptr<mocker::nasm::Label> *)local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,(ulong)((long)(_Hash_node_base **)local_d8._16_8_ + 1))
      ;
    }
    goto joined_r0x00118e42;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
  }
LAB_00117aa2:
  if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
  }
joined_r0x00118e42:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00117c4b:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_nxt);
  }
  return (InstListIter)p_Var16;
}

Assistant:

ir::InstListIter genInst(nasm::Section &text, FuncSelectionContext &ctx,
                         const ir::FunctionModule &func,
                         ir::BasicBlockList::const_iterator curBBIter,
                         ir::BasicBlockList::const_iterator bbIterEnd,
                         ir::InstListIter curInstIter) {
  auto &inst = *curInstIter;
  auto nextIter = curInstIter;
  ++nextIter;
  auto nextBBIter = curBBIter;
  ++nextBBIter;

  if (ir::dyc<ir::Comment>(inst) || ir::dyc<ir::AttachedComment>(inst))
    return nextIter;

  if (ir::dyc<ir::Phi>(inst))
    return nextIter;

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    text.emplaceInst<nasm::Mov>(ctx.getIrAddr(p->getDest()),
                                ctx.getIrAddr(p->getOperand()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Jump>(inst)) {
    if (nextBBIter == bbIterEnd ||
        nextBBIter->getLabelID() != p->getLabel()->getID())
      text.emplaceInst<nasm::Jmp>(std::make_shared<nasm::Label>(
          ".L" + std::to_string(p->getLabel()->getID())));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Store>(inst)) {
    genStore(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Load>(inst)) {
    genLoad(text, ctx, p);
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    auto nextInst = *nextIter;
    auto add = ir::dyc<ir::ArithBinaryInst>(nextInst);
    if (!add) {
      genArithBinary(text, ctx, p);
      return nextIter;
    }
    auto nextNextIter = nextIter;
    ++nextNextIter;
    if (tryCombineMemInst(text, ctx, p, add, *nextNextIter)) {
      ++nextIter;
      ++nextIter;
    } else {
      genArithBinary(text, ctx, p);
    }
    return nextIter;
  }

  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    auto skip =
        genRelation(text, ctx, p, *nextIter,
                    nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    if (skip)
      ++nextIter;
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Branch>(inst)) {
    genBranch(text, ctx, p,
              nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Ret>(inst)) {
    if (p->getVal()) {
      auto val = ctx.getIrAddr(p->getVal());
      text.emplaceInst<nasm::Mov>(nasm::rax(), val);
    }
    for (auto &reg : CalleeSave) {
      text.emplaceInst<nasm::Mov>(reg, ctx.getPRegAddr(reg));
    }
    text.emplaceInst<nasm::Leave>();
    text.emplaceInst<nasm::Ret>();
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Call>(inst)) {
    genCall(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Malloc>(inst)) {
    genCall(text, ctx,
            std::make_shared<ir::Call>(p->getDest(), "__alloc", p->getSize()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    auto dest = nasm::dyc<nasm::Register>(ctx.getIrAddr(p->getDest()));
    assert(dest);
    text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(p->getOperand()));
    if (p->getOp() == ir::ArithUnaryInst::Neg)
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Neg, dest);
    else
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Not, dest);
    return nextIter;
  }
  assert(false);
}